

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_struct_size_msl
          (CompilerMSL *this,SPIRType *struct_type,bool ignore_alignment,bool ignore_padding)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint *puVar5;
  uint32_t msl_size;
  uint32_t spirv_offset;
  uint32_t mbr_alignment;
  uint32_t i;
  uint32_t alignment;
  uint32_t mbr_cnt;
  bool ignore_padding_local;
  bool ignore_alignment_local;
  SPIRType *struct_type_local;
  CompilerMSL *this_local;
  
  alignment._2_1_ = ignore_padding;
  alignment._3_1_ = ignore_alignment;
  _mbr_cnt = struct_type;
  struct_type_local = (SPIRType *)this;
  if (!ignore_padding) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(struct_type->super_IVariant).self);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,uVar2,SPIRVCrossDecorationPaddingTarget);
    if (bVar1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_mbr_cnt->super_IVariant).self);
      uVar2 = Compiler::get_extended_decoration
                        ((Compiler *)this,uVar2,SPIRVCrossDecorationPaddingTarget);
      return uVar2;
    }
  }
  bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                    (&(_mbr_cnt->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(_mbr_cnt->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    i = (uint32_t)sVar4;
    mbr_alignment = 1;
    if ((alignment._3_1_ & 1) == 0) {
      for (spirv_offset = 0; spirv_offset < i; spirv_offset = spirv_offset + 1) {
        msl_size = get_declared_struct_member_alignment_msl(this,_mbr_cnt,spirv_offset);
        puVar5 = ::std::max<unsigned_int>(&mbr_alignment,&msl_size);
        mbr_alignment = *puVar5;
      }
    }
    uVar2 = Compiler::type_struct_member_offset((Compiler *)this,_mbr_cnt,i - 1);
    uVar3 = get_declared_struct_member_size_msl(this,_mbr_cnt,i - 1);
    this_local._4_4_ = (uVar2 + uVar3 + mbr_alignment) - 1 & (mbr_alignment - 1 ^ 0xffffffff);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_declared_struct_size_msl(const SPIRType &struct_type, bool ignore_alignment,
                                                   bool ignore_padding) const
{
	// If we have a target size, that is the declared size as well.
	if (!ignore_padding && has_extended_decoration(struct_type.self, SPIRVCrossDecorationPaddingTarget))
		return get_extended_decoration(struct_type.self, SPIRVCrossDecorationPaddingTarget);

	if (struct_type.member_types.empty())
		return 0;

	uint32_t mbr_cnt = uint32_t(struct_type.member_types.size());

	// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
	uint32_t alignment = 1;

	if (!ignore_alignment)
	{
		for (uint32_t i = 0; i < mbr_cnt; i++)
		{
			uint32_t mbr_alignment = get_declared_struct_member_alignment_msl(struct_type, i);
			alignment = max(alignment, mbr_alignment);
		}
	}

	// Last member will always be matched to the final Offset decoration, but size of struct in MSL now depends
	// on physical size in MSL, and the size of the struct itself is then aligned to struct alignment.
	uint32_t spirv_offset = type_struct_member_offset(struct_type, mbr_cnt - 1);
	uint32_t msl_size = spirv_offset + get_declared_struct_member_size_msl(struct_type, mbr_cnt - 1);
	msl_size = (msl_size + alignment - 1) & ~(alignment - 1);
	return msl_size;
}